

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_draw_list_path_rect_to(nk_draw_list *list,nk_vec2 a,nk_vec2 b,float rounding)

{
  nk_vec2 pos;
  nk_vec2 pos_00;
  nk_vec2 pos_01;
  nk_vec2 pos_02;
  nk_vec2 pos_03;
  nk_vec2 pos_04;
  long lVar1;
  int a_1;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  fVar5 = b.x;
  fVar6 = b.y;
  fVar3 = a.x;
  fVar4 = a.y;
  if (list == (nk_draw_list *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x2709,
                  "void nk_draw_list_path_rect_to(struct nk_draw_list *, struct nk_vec2, struct nk_vec2, float)"
                 );
  }
  fVar7 = fVar5 - fVar3;
  fVar8 = -fVar7;
  if (-fVar7 <= fVar7) {
    fVar8 = fVar7;
  }
  if (fVar8 <= rounding) {
    rounding = fVar8;
  }
  fVar7 = fVar6 - fVar4;
  fVar8 = -fVar7;
  if (-fVar7 <= fVar7) {
    fVar8 = fVar7;
  }
  if (fVar8 <= rounding) {
    rounding = fVar8;
  }
  if ((rounding == 0.0) && (!NAN(rounding))) {
    nk_draw_list_path_line_to(list,a);
    pos_03.y = fVar4;
    pos_03.x = fVar5;
    nk_draw_list_path_line_to(list,pos_03);
    nk_draw_list_path_line_to(list,b);
    pos_04.y = fVar6;
    pos_04.x = fVar3;
    nk_draw_list_path_line_to(list,pos_04);
    return;
  }
  lVar2 = 8;
  do {
    pos.y = list->circle_vtx[lVar2 + -2].y * rounding + fVar4 + rounding;
    pos.x = list->circle_vtx[lVar2 + -2].x * rounding + fVar3 + rounding;
    nk_draw_list_path_line_to(list,pos);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0xc);
  lVar2 = 9;
  do {
    lVar1 = lVar2;
    if (lVar2 == 0xc) {
      lVar1 = 0;
    }
    pos_00.y = list->circle_vtx[lVar1].y * rounding + fVar4 + rounding;
    pos_00.x = list->circle_vtx[lVar1].x * rounding + (fVar5 - rounding);
    nk_draw_list_path_line_to(list,pos_00);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0xd);
  lVar2 = 2;
  do {
    pos_01.y = list->circle_vtx[lVar2 + -2].y * rounding + (fVar6 - rounding);
    pos_01.x = list->circle_vtx[lVar2 + -2].x * rounding + (fVar5 - rounding);
    nk_draw_list_path_line_to(list,pos_01);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 6);
  lVar2 = 5;
  do {
    pos_02.y = list->circle_vtx[lVar2 + -2].y * rounding + (fVar6 - rounding);
    pos_02.x = list->circle_vtx[lVar2 + -2].x * rounding + fVar3 + rounding;
    nk_draw_list_path_line_to(list,pos_02);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 9);
  return;
}

Assistant:

NK_API void
nk_draw_list_path_rect_to(struct nk_draw_list *list, struct nk_vec2 a,
    struct nk_vec2 b, float rounding)
{
    float r;
    NK_ASSERT(list);
    if (!list) return;
    r = rounding;
    r = NK_MIN(r, ((b.x-a.x) < 0) ? -(b.x-a.x): (b.x-a.x));
    r = NK_MIN(r, ((b.y-a.y) < 0) ? -(b.y-a.y): (b.y-a.y));

    if (r == 0.0f) {
        nk_draw_list_path_line_to(list, a);
        nk_draw_list_path_line_to(list, nk_vec2(b.x,a.y));
        nk_draw_list_path_line_to(list, b);
        nk_draw_list_path_line_to(list, nk_vec2(a.x,b.y));
    } else {
        nk_draw_list_path_arc_to_fast(list, nk_vec2(a.x + r, a.y + r), r, 6, 9);
        nk_draw_list_path_arc_to_fast(list, nk_vec2(b.x - r, a.y + r), r, 9, 12);
        nk_draw_list_path_arc_to_fast(list, nk_vec2(b.x - r, b.y - r), r, 0, 3);
        nk_draw_list_path_arc_to_fast(list, nk_vec2(a.x + r, b.y - r), r, 3, 6);
    }
}